

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

wchar_t is_padding_changed(term *t,wchar_t y,wchar_t x)

{
  int local_38;
  wchar_t local_34;
  int local_30;
  wchar_t local_2c;
  wchar_t ys;
  wchar_t xs;
  wchar_t ysl;
  wchar_t xsl;
  wchar_t x_local;
  wchar_t y_local;
  term *t_local;
  
  if (t->wid < x + (uint)tile_width) {
    local_34 = t->wid;
  }
  else {
    local_34 = x + (uint)tile_width;
  }
  if (t->hgt < y + (uint)tile_height) {
    local_38 = t->hgt;
  }
  else {
    local_38 = y + (uint)tile_height;
  }
  for (local_2c = x + L'\x01'; local_2c < local_34; local_2c = local_2c + L'\x01') {
    if ((t->scr->a[y][local_2c] == 0xff) &&
       (((t->scr->a[y][local_2c] != t->old->a[y][local_2c] ||
         (t->scr->c[y][local_2c] != t->old->c[y][local_2c])) ||
        ((t->scr->ta[y][local_2c] != t->old->ta[y][local_2c] ||
         (t->scr->tc[y][local_2c] != t->old->tc[y][local_2c])))))) {
      return L'\x01';
    }
  }
  local_30 = y + L'\x01';
  do {
    local_2c = x;
    if (local_38 <= local_30) {
      return L'\0';
    }
    for (; local_2c < local_34; local_2c = local_2c + L'\x01') {
      if ((t->scr->a[local_30][local_2c] == 0xff) &&
         ((((t->scr->a[local_30][local_2c] != t->old->a[local_30][local_2c] ||
            (t->scr->c[local_30][local_2c] != t->old->c[local_30][local_2c])) ||
           (t->scr->ta[local_30][local_2c] != t->old->ta[local_30][local_2c])) ||
          (t->scr->tc[local_30][local_2c] != t->old->tc[local_30][local_2c])))) {
        return L'\x01';
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static int is_padding_changed(term *t, int y, int x)
{
	int xsl = MIN(x + tile_width, t->wid);
	int ysl = MIN(y + tile_height, t->hgt);
	int xs, ys;

	for (xs = x + 1; xs < xsl; ++xs) {
		if (t->scr->a[y][xs] == 255 &&
				(t->scr->a[y][xs] != t->old->a[y][xs] ||
				t->scr->c[y][xs] != t->old->c[y][xs] ||
				t->scr->ta[y][xs] != t->old->ta[y][xs] ||
				t->scr->tc[y][xs] != t->old->tc[y][xs])) {
			return 1;
		}
	}
	for (ys = y + 1; ys < ysl; ++ys) {
		for (xs = x; xs < xsl; ++xs) {
			if (t->scr->a[ys][xs] == 255 &&
					(t->scr->a[ys][xs] != t->old->a[ys][xs] ||
					t->scr->c[ys][xs] != t->old->c[ys][xs] ||
					t->scr->ta[ys][xs] != t->old->ta[ys][xs] ||
					t->scr->tc[ys][xs] != t->old->tc[ys][xs])) {
				return 1;
			}
		}
	}
	return 0;
}